

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O2

bool chaiscript::ChaiScript_Basic::skip_bom(ifstream *infile)

{
  ulong in_RAX;
  bool bVar1;
  char buffer [3];
  ulong uStack_18;
  
  uStack_18 = in_RAX & 0xff000000ffffffff;
  std::istream::read((char *)infile,(long)buffer);
  bVar1 = buffer[2] == -0x41 && (buffer[1] == -0x45 && buffer[0] == -0x11);
  std::istream::seekg(infile,bVar1 * '\x03',0);
  return bVar1;
}

Assistant:

static bool skip_bom(std::ifstream &infile) {
      size_t bytes_needed = 3;
      char buffer[3];

      memset(buffer, '\0', bytes_needed);

      infile.read(buffer, static_cast<std::streamsize>(bytes_needed));

      if ((buffer[0] == '\xef') && (buffer[1] == '\xbb') && (buffer[2] == '\xbf')) {
        infile.seekg(3);
        return true;
      }

      infile.seekg(0);

      return false;
    }